

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Mish_x86_avx::forward_inplace(Mish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  long lVar8;
  undefined1 (*pauVar9) [32];
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar22 [16];
  float fVar21;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  float fVar41;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  float fVar39;
  float fVar40;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 in_ZMM2 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  float fStack_40;
  
  iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar14 = 0;
  uVar13 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar13 = uVar14;
  }
  for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
    pvVar2 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->elemsize;
    sVar4 = bottom_top_blob->cstep;
    pauVar9 = (undefined1 (*) [32])(sVar4 * uVar14 * sVar3 + (long)pvVar2);
    lVar12 = 0;
    for (iVar11 = 0; iVar11 + 7 < iVar10; iVar11 = iVar11 + 8) {
      auVar1 = *pauVar9;
      auVar61._8_4_ = 0x42b0c0a5;
      auVar61._0_8_ = 0x42b0c0a542b0c0a5;
      auVar61._12_4_ = 0x42b0c0a5;
      auVar61._16_4_ = 0x42b0c0a5;
      auVar61._20_4_ = 0x42b0c0a5;
      auVar61._24_4_ = 0x42b0c0a5;
      auVar61._28_4_ = 0x42b0c0a5;
      auVar16 = vminps_avx(auVar1,auVar61);
      auVar63._8_4_ = 0xc2b0c0a5;
      auVar63._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar63._12_4_ = 0xc2b0c0a5;
      auVar63._16_4_ = 0xc2b0c0a5;
      auVar63._20_4_ = 0xc2b0c0a5;
      auVar63._24_4_ = 0xc2b0c0a5;
      auVar63._28_4_ = 0xc2b0c0a5;
      auVar34 = vmaxps_avx(auVar63,auVar16);
      auVar65._8_4_ = 0x3f000000;
      auVar65._0_8_ = 0x3f0000003f000000;
      auVar65._12_4_ = 0x3f000000;
      auVar65._16_4_ = 0x3f000000;
      auVar65._20_4_ = 0x3f000000;
      auVar65._24_4_ = 0x3f000000;
      auVar65._28_4_ = 0x3f000000;
      auVar32._0_4_ = auVar34._0_4_ * 1.442695 + 0.5;
      auVar32._4_4_ = auVar34._4_4_ * 1.442695 + 0.5;
      auVar32._8_4_ = auVar34._8_4_ * 1.442695 + 0.5;
      auVar32._12_4_ = auVar34._12_4_ * 1.442695 + 0.5;
      auVar32._16_4_ = auVar34._16_4_ * 1.442695 + 0.5;
      auVar32._20_4_ = auVar34._20_4_ * 1.442695 + 0.5;
      auVar32._24_4_ = auVar34._24_4_ * 1.442695 + 0.5;
      auVar32._28_4_ = in_ZMM2._28_4_ + 0.5;
      auVar36 = vroundps_avx(auVar32,1);
      auVar16 = vcmpps_avx(auVar32,auVar36,1);
      auVar66._8_4_ = 0x3f800000;
      auVar66._0_8_ = 0x3f8000003f800000;
      auVar66._12_4_ = 0x3f800000;
      auVar66._16_4_ = 0x3f800000;
      auVar66._20_4_ = 0x3f800000;
      auVar66._24_4_ = 0x3f800000;
      auVar66._28_4_ = 0x3f800000;
      auVar16 = vandps_avx(auVar66,auVar16);
      auVar16 = vsubps_avx(auVar36,auVar16);
      auVar5._4_4_ = auVar16._4_4_ * 0.6931472;
      auVar5._0_4_ = auVar16._0_4_ * 0.6931472;
      auVar5._8_4_ = auVar16._8_4_ * 0.6931472;
      auVar5._12_4_ = auVar16._12_4_ * 0.6931472;
      auVar5._16_4_ = auVar16._16_4_ * 0.6931472;
      auVar5._20_4_ = auVar16._20_4_ * 0.6931472;
      auVar5._24_4_ = auVar16._24_4_ * 0.6931472;
      auVar5._28_4_ = auVar36._28_4_;
      auVar34 = vsubps_avx(auVar34,auVar5);
      fVar21 = auVar34._0_4_;
      fVar39 = auVar34._4_4_;
      fVar40 = auVar34._8_4_;
      fVar41 = auVar34._12_4_;
      fVar42 = auVar34._16_4_;
      fVar43 = auVar34._20_4_;
      fVar44 = auVar34._24_4_;
      auVar22._0_4_ = (int)auVar16._0_4_;
      auVar22._4_4_ = (int)auVar16._4_4_;
      auVar22._8_4_ = (int)auVar16._8_4_;
      auVar22._12_4_ = (int)auVar16._12_4_;
      auVar33._16_4_ = (int)auVar16._16_4_;
      auVar33._0_16_ = auVar22;
      auVar33._20_4_ = (int)auVar16._20_4_;
      auVar33._24_4_ = (int)auVar16._24_4_;
      auVar33._28_4_ = (int)auVar16._28_4_;
      auVar45 = vpslld_avx(auVar22,0x17);
      auVar22 = vpslld_avx(auVar33._16_16_,0x17);
      auVar48._8_4_ = 0x3f800000;
      auVar48._0_8_ = 0x3f8000003f800000;
      auVar48._12_4_ = 0x3f800000;
      auVar22 = vpaddd_avx(auVar22,auVar48);
      auVar45 = vpaddd_avx(auVar45,auVar48);
      auVar19._0_4_ =
           (fVar21 + 1.0 +
           fVar21 * fVar21 *
           (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
             0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5)) * auVar45._0_4_ + 1.0;
      auVar19._4_4_ =
           (fVar39 + 1.0 +
           fVar39 * fVar39 *
           (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
             0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar45._4_4_ + 1.0;
      auVar19._8_4_ =
           (fVar40 + 1.0 +
           fVar40 * fVar40 *
           (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
             0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar45._8_4_ + 1.0;
      auVar19._12_4_ =
           (fVar41 + 1.0 +
           fVar41 * fVar41 *
           (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
             0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar45._12_4_ + 1.0;
      auVar19._16_4_ =
           (fVar42 + 1.0 +
           fVar42 * fVar42 *
           (((((fVar42 * 0.00019875691 + 0.0013981999) * fVar42 + 0.008333452) * fVar42 +
             0.041665796) * fVar42 + 0.16666666) * fVar42 + 0.5)) * auVar22._0_4_ + 1.0;
      auVar19._20_4_ =
           (fVar43 + 1.0 +
           fVar43 * fVar43 *
           (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
             0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5)) * auVar22._4_4_ + 1.0;
      auVar19._24_4_ =
           (fVar44 + 1.0 +
           fVar44 * fVar44 *
           (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
             0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar22._8_4_ + 1.0;
      auVar19._28_4_ = auVar34._28_4_ + 1.0 + auVar36._28_4_ + 1.0;
      auVar34._8_4_ = 0x800000;
      auVar34._0_8_ = 0x80000000800000;
      auVar34._12_4_ = 0x800000;
      auVar34._16_4_ = 0x800000;
      auVar34._20_4_ = 0x800000;
      auVar34._24_4_ = 0x800000;
      auVar34._28_4_ = 0x800000;
      auVar36 = vmaxps_avx(auVar19,auVar34);
      auVar22 = vpsrld_avx(auVar36._16_16_,0x17);
      auVar35._8_4_ = 0x807fffff;
      auVar35._0_8_ = 0x807fffff807fffff;
      auVar35._12_4_ = 0x807fffff;
      auVar35._16_4_ = 0x807fffff;
      auVar35._20_4_ = 0x807fffff;
      auVar35._24_4_ = 0x807fffff;
      auVar35._28_4_ = 0x807fffff;
      auVar16 = vandps_avx(auVar36,auVar35);
      auVar5 = vorps_avx(auVar65,auVar16);
      auVar57._8_4_ = 0x3f3504f3;
      auVar57._0_8_ = 0x3f3504f33f3504f3;
      auVar57._12_4_ = 0x3f3504f3;
      auVar57._16_4_ = 0x3f3504f3;
      auVar57._20_4_ = 0x3f3504f3;
      auVar57._24_4_ = 0x3f3504f3;
      auVar57._28_4_ = 0x3f3504f3;
      auVar34 = vcmpps_avx(auVar57,auVar5,2);
      auVar16 = vandnps_avx(auVar34,auVar5);
      fVar21 = auVar5._0_4_ + -1.0 + auVar16._0_4_;
      fVar39 = auVar5._4_4_ + -1.0 + auVar16._4_4_;
      fVar40 = auVar5._8_4_ + -1.0 + auVar16._8_4_;
      fVar41 = auVar5._12_4_ + -1.0 + auVar16._12_4_;
      fVar42 = auVar5._16_4_ + -1.0 + auVar16._16_4_;
      fVar43 = auVar5._20_4_ + -1.0 + auVar16._20_4_;
      fVar44 = auVar5._24_4_ + -1.0 + auVar16._24_4_;
      auVar22 = vpsubd_avx(auVar22,auVar34._16_16_);
      auVar45 = vpsrld_avx(auVar36._0_16_,0x17);
      auVar58._8_4_ = 0xffffff81;
      auVar58._0_8_ = 0xffffff81ffffff81;
      auVar58._12_4_ = 0xffffff81;
      auVar22 = vpaddd_avx(auVar22,auVar58);
      auVar45 = vpsubd_avx(auVar45,auVar34._0_16_);
      auVar45 = vpaddd_avx(auVar45,auVar58);
      auVar52._16_16_ = auVar22;
      auVar52._0_16_ = auVar45;
      auVar34 = vcmpps_avx(auVar19,_DAT_00548840,2);
      auVar36 = vcvtdq2ps_avx(auVar52);
      auVar6._4_4_ = (auVar36._4_4_ * 0.6931472 + fVar39 +
                     fVar39 * fVar39 *
                     (((((((((fVar39 * 0.070376836 + -0.1151461) * fVar39 + 0.116769984) * fVar39 +
                           -0.12420141) * fVar39 + 0.14249323) * fVar39 + -0.16668057) * fVar39 +
                        0.20000714) * fVar39 + -0.24999994) * fVar39 + 0.3333333) * fVar39 + -0.5))
                     * -2.0;
      auVar6._0_4_ = (auVar36._0_4_ * 0.6931472 + fVar21 +
                     fVar21 * fVar21 *
                     (((((((((fVar21 * 0.070376836 + -0.1151461) * fVar21 + 0.116769984) * fVar21 +
                           -0.12420141) * fVar21 + 0.14249323) * fVar21 + -0.16668057) * fVar21 +
                        0.20000714) * fVar21 + -0.24999994) * fVar21 + 0.3333333) * fVar21 + -0.5))
                     * -2.0;
      auVar6._8_4_ = (auVar36._8_4_ * 0.6931472 + fVar40 +
                     fVar40 * fVar40 *
                     (((((((((fVar40 * 0.070376836 + -0.1151461) * fVar40 + 0.116769984) * fVar40 +
                           -0.12420141) * fVar40 + 0.14249323) * fVar40 + -0.16668057) * fVar40 +
                        0.20000714) * fVar40 + -0.24999994) * fVar40 + 0.3333333) * fVar40 + -0.5))
                     * -2.0;
      auVar6._12_4_ =
           (auVar36._12_4_ * 0.6931472 + fVar41 +
           fVar41 * fVar41 *
           (((((((((fVar41 * 0.070376836 + -0.1151461) * fVar41 + 0.116769984) * fVar41 +
                 -0.12420141) * fVar41 + 0.14249323) * fVar41 + -0.16668057) * fVar41 + 0.20000714)
              * fVar41 + -0.24999994) * fVar41 + 0.3333333) * fVar41 + -0.5)) * -2.0;
      auVar6._16_4_ =
           (auVar36._16_4_ * 0.6931472 + fVar42 +
           fVar42 * fVar42 *
           (((((((((fVar42 * 0.070376836 + -0.1151461) * fVar42 + 0.116769984) * fVar42 +
                 -0.12420141) * fVar42 + 0.14249323) * fVar42 + -0.16668057) * fVar42 + 0.20000714)
              * fVar42 + -0.24999994) * fVar42 + 0.3333333) * fVar42 + -0.5)) * -2.0;
      auVar6._20_4_ =
           (auVar36._20_4_ * 0.6931472 + fVar43 +
           fVar43 * fVar43 *
           (((((((((fVar43 * 0.070376836 + -0.1151461) * fVar43 + 0.116769984) * fVar43 +
                 -0.12420141) * fVar43 + 0.14249323) * fVar43 + -0.16668057) * fVar43 + 0.20000714)
              * fVar43 + -0.24999994) * fVar43 + 0.3333333) * fVar43 + -0.5)) * -2.0;
      auVar6._24_4_ =
           (auVar36._24_4_ * 0.6931472 + fVar44 +
           fVar44 * fVar44 *
           (((((((((fVar44 * 0.070376836 + -0.1151461) * fVar44 + 0.116769984) * fVar44 +
                 -0.12420141) * fVar44 + 0.14249323) * fVar44 + -0.16668057) * fVar44 + 0.20000714)
              * fVar44 + -0.24999994) * fVar44 + 0.3333333) * fVar44 + -0.5)) * -2.0;
      auVar6._28_4_ = auVar36._28_4_ + auVar5._28_4_ + -1.0 + auVar16._28_4_ + 0.0;
      auVar53._8_4_ = 0x7fffffff;
      auVar53._0_8_ = 0x7fffffff7fffffff;
      auVar53._12_4_ = 0x7fffffff;
      auVar53._16_4_ = 0x7fffffff;
      auVar53._20_4_ = 0x7fffffff;
      auVar53._24_4_ = 0x7fffffff;
      auVar53._28_4_ = 0x7fffffff;
      auVar16 = vblendvps_avx(auVar6,auVar53,auVar34);
      auVar36._8_4_ = 0x42b0c0a5;
      auVar36._0_8_ = 0x42b0c0a542b0c0a5;
      auVar36._12_4_ = 0x42b0c0a5;
      auVar36._16_4_ = 0x42b0c0a5;
      auVar36._20_4_ = 0x42b0c0a5;
      auVar36._24_4_ = 0x42b0c0a5;
      auVar36._28_4_ = 0x42b0c0a5;
      auVar16 = vminps_avx(auVar16,auVar36);
      auVar34 = vmaxps_avx(auVar63,auVar16);
      auVar37._0_4_ = auVar34._0_4_ * 1.442695 + 0.5;
      auVar37._4_4_ = auVar34._4_4_ * 1.442695 + 0.5;
      auVar37._8_4_ = auVar34._8_4_ * 1.442695 + 0.5;
      auVar37._12_4_ = auVar34._12_4_ * 1.442695 + 0.5;
      auVar37._16_4_ = auVar34._16_4_ * 1.442695 + 0.5;
      auVar37._20_4_ = auVar34._20_4_ * 1.442695 + 0.5;
      auVar37._24_4_ = auVar34._24_4_ * 1.442695 + 0.5;
      auVar37._28_4_ = 0x42b1c0a5;
      auVar36 = vroundps_avx(auVar37,1);
      auVar16 = vcmpps_avx(auVar37,auVar36,1);
      auVar16 = vandps_avx(auVar66,auVar16);
      auVar16 = vsubps_avx(auVar36,auVar16);
      auVar7._4_4_ = auVar16._4_4_ * 0.6931472;
      auVar7._0_4_ = auVar16._0_4_ * 0.6931472;
      auVar7._8_4_ = auVar16._8_4_ * 0.6931472;
      auVar7._12_4_ = auVar16._12_4_ * 0.6931472;
      auVar7._16_4_ = auVar16._16_4_ * 0.6931472;
      auVar7._20_4_ = auVar16._20_4_ * 0.6931472;
      auVar7._24_4_ = auVar16._24_4_ * 0.6931472;
      auVar7._28_4_ = auVar36._28_4_;
      auVar34 = vsubps_avx(auVar34,auVar7);
      fVar21 = auVar34._0_4_;
      fVar39 = auVar34._4_4_;
      fVar40 = auVar34._8_4_;
      fVar41 = auVar34._12_4_;
      fVar42 = auVar34._16_4_;
      fVar43 = auVar34._20_4_;
      fVar44 = auVar34._24_4_;
      auVar45._0_4_ = (int)auVar16._0_4_;
      auVar45._4_4_ = (int)auVar16._4_4_;
      auVar45._8_4_ = (int)auVar16._8_4_;
      auVar45._12_4_ = (int)auVar16._12_4_;
      auVar38._16_4_ = (int)auVar16._16_4_;
      auVar38._0_16_ = auVar45;
      auVar38._20_4_ = (int)auVar16._20_4_;
      auVar38._24_4_ = (int)auVar16._24_4_;
      auVar38._28_4_ = (int)auVar16._28_4_;
      auVar45 = vpslld_avx(auVar45,0x17);
      auVar22 = vpslld_avx(auVar38._16_16_,0x17);
      auVar22 = vpaddd_avx(auVar22,auVar48);
      auVar45 = vpaddd_avx(auVar45,auVar48);
      in_ZMM2 = ZEXT3264(CONCAT1616(auVar22,auVar45));
      auVar20._0_4_ =
           (fVar21 + 1.0 +
           fVar21 * fVar21 *
           (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
             0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5)) * auVar45._0_4_ + 1.0;
      auVar20._4_4_ =
           (fVar39 + 1.0 +
           fVar39 * fVar39 *
           (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
             0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar45._4_4_ + 1.0;
      auVar20._8_4_ =
           (fVar40 + 1.0 +
           fVar40 * fVar40 *
           (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
             0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar45._8_4_ + 1.0;
      auVar20._12_4_ =
           (fVar41 + 1.0 +
           fVar41 * fVar41 *
           (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
             0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar45._12_4_ + 1.0;
      auVar20._16_4_ =
           (fVar42 + 1.0 +
           fVar42 * fVar42 *
           (((((fVar42 * 0.00019875691 + 0.0013981999) * fVar42 + 0.008333452) * fVar42 +
             0.041665796) * fVar42 + 0.16666666) * fVar42 + 0.5)) * auVar22._0_4_ + 1.0;
      auVar20._20_4_ =
           (fVar43 + 1.0 +
           fVar43 * fVar43 *
           (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
             0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5)) * auVar22._4_4_ + 1.0;
      auVar20._24_4_ =
           (fVar44 + 1.0 +
           fVar44 * fVar44 *
           (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
             0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar22._8_4_ + 1.0;
      auVar20._28_4_ = auVar34._28_4_ + 1.0 + auVar36._28_4_ + 1.0;
      auVar16._8_4_ = 0x40000000;
      auVar16._0_8_ = 0x4000000040000000;
      auVar16._12_4_ = 0x40000000;
      auVar16._16_4_ = 0x40000000;
      auVar16._20_4_ = 0x40000000;
      auVar16._24_4_ = 0x40000000;
      auVar16._28_4_ = 0x40000000;
      auVar16 = vdivps_avx(auVar16,auVar20);
      local_58 = auVar1._0_4_;
      fStack_54 = auVar1._4_4_;
      fStack_50 = auVar1._8_4_;
      fStack_4c = auVar1._12_4_;
      fStack_48 = auVar1._16_4_;
      fStack_44 = auVar1._20_4_;
      fStack_40 = auVar1._24_4_;
      auVar1._4_4_ = (auVar16._4_4_ + -1.0) * fStack_54;
      auVar1._0_4_ = (auVar16._0_4_ + -1.0) * local_58;
      auVar1._8_4_ = (auVar16._8_4_ + -1.0) * fStack_50;
      auVar1._12_4_ = (auVar16._12_4_ + -1.0) * fStack_4c;
      auVar1._16_4_ = (auVar16._16_4_ + -1.0) * fStack_48;
      auVar1._20_4_ = (auVar16._20_4_ + -1.0) * fStack_44;
      auVar1._24_4_ = (auVar16._24_4_ + -1.0) * fStack_40;
      auVar1._28_4_ = 0x40000000;
      *pauVar9 = auVar1;
      pauVar9 = pauVar9 + 1;
      lVar12 = lVar12 + 8;
    }
    for (; iVar11 + 3 < iVar10; iVar11 = iVar11 + 4) {
      auVar22 = *(undefined1 (*) [16])*pauVar9;
      auVar60._8_4_ = 0x42b0c0a5;
      auVar60._0_8_ = 0x42b0c0a542b0c0a5;
      auVar60._12_4_ = 0x42b0c0a5;
      auVar45 = vminps_avx(auVar22,auVar60);
      auVar62._8_4_ = 0xc2b0c0a5;
      auVar62._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar62._12_4_ = 0xc2b0c0a5;
      auVar58 = vmaxps_avx(auVar62,auVar45);
      auVar64._8_4_ = 0x3f000000;
      auVar64._0_8_ = 0x3f0000003f000000;
      auVar64._12_4_ = 0x3f000000;
      auVar23._0_4_ = auVar58._0_4_ * 1.442695 + 0.5;
      auVar23._4_4_ = auVar58._4_4_ * 1.442695 + 0.5;
      auVar23._8_4_ = auVar58._8_4_ * 1.442695 + 0.5;
      auVar23._12_4_ = auVar58._12_4_ * 1.442695 + 0.5;
      auVar46._0_4_ = (int)auVar23._0_4_;
      auVar46._4_4_ = (int)auVar23._4_4_;
      auVar46._8_4_ = (int)auVar23._8_4_;
      auVar46._12_4_ = (int)auVar23._12_4_;
      auVar48 = vcvtdq2ps_avx(auVar46);
      auVar45 = vcmpps_avx(auVar23,auVar48,1);
      auVar59._8_4_ = 0x3f800000;
      auVar59._0_8_ = 0x3f8000003f800000;
      auVar59._12_4_ = 0x3f800000;
      auVar45 = vandps_avx(auVar45,auVar59);
      auVar45 = vsubps_avx(auVar48,auVar45);
      auVar47._0_4_ = auVar45._0_4_ * 0.6931472;
      auVar47._4_4_ = auVar45._4_4_ * 0.6931472;
      auVar47._8_4_ = auVar45._8_4_ * 0.6931472;
      auVar47._12_4_ = auVar45._12_4_ * 0.6931472;
      auVar48 = vsubps_avx(auVar58,auVar47);
      fVar21 = auVar48._0_4_;
      fVar39 = auVar48._4_4_;
      fVar40 = auVar48._8_4_;
      fVar41 = auVar48._12_4_;
      auVar24._0_4_ = (int)auVar45._0_4_;
      auVar24._4_4_ = (int)auVar45._4_4_;
      auVar24._8_4_ = (int)auVar45._8_4_;
      auVar24._12_4_ = (int)auVar45._12_4_;
      auVar45 = vpslld_avx(auVar24,0x17);
      auVar45 = vpaddd_avx(auVar45,auVar59);
      auVar17._0_4_ =
           (fVar21 + 1.0 +
           fVar21 * fVar21 *
           (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
             0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5)) * auVar45._0_4_ + 1.0;
      auVar17._4_4_ =
           (fVar39 + 1.0 +
           fVar39 * fVar39 *
           (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
             0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar45._4_4_ + 1.0;
      auVar17._8_4_ =
           (fVar40 + 1.0 +
           fVar40 * fVar40 *
           (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
             0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar45._8_4_ + 1.0;
      auVar17._12_4_ =
           (fVar41 + 1.0 +
           fVar41 * fVar41 *
           (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
             0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar45._12_4_ + 1.0;
      auVar25._8_4_ = 0x800000;
      auVar25._0_8_ = 0x80000000800000;
      auVar25._12_4_ = 0x800000;
      auVar45 = vmaxps_avx(auVar17,auVar25);
      auVar48 = vpsrld_avx(auVar45,0x17);
      auVar54._8_4_ = 0xffffff82;
      auVar54._0_8_ = 0xffffff82ffffff82;
      auVar54._12_4_ = 0xffffff82;
      auVar48 = vpaddd_avx(auVar48,auVar54);
      auVar55._8_4_ = 0x807fffff;
      auVar55._0_8_ = 0x807fffff807fffff;
      auVar55._12_4_ = 0x807fffff;
      auVar45 = vandps_avx(auVar45,auVar55);
      auVar15 = vorps_avx(auVar64,auVar45);
      auVar58 = vcvtdq2ps_avx(auVar48);
      auVar56._8_4_ = 0x3f3504f3;
      auVar56._0_8_ = 0x3f3504f33f3504f3;
      auVar56._12_4_ = 0x3f3504f3;
      auVar48 = vcmpps_avx(auVar15,auVar56,1);
      auVar45 = vandps_avx(auVar48,auVar15);
      fVar21 = auVar15._0_4_ + -1.0 + auVar45._0_4_;
      fVar39 = auVar15._4_4_ + -1.0 + auVar45._4_4_;
      fVar40 = auVar15._8_4_ + -1.0 + auVar45._8_4_;
      fVar41 = auVar15._12_4_ + -1.0 + auVar45._12_4_;
      auVar45 = vandps_avx(auVar48,auVar59);
      auVar48 = vsubps_avx(auVar58,auVar45);
      auVar45 = vcmpps_avx(auVar17,_DAT_00545cc0,2);
      auVar26._0_4_ =
           (auVar48._0_4_ * 0.6931472 + fVar21 +
           fVar21 * fVar21 *
           (((((((((fVar21 * 0.070376836 + -0.1151461) * fVar21 + 0.116769984) * fVar21 +
                 -0.12420141) * fVar21 + 0.14249323) * fVar21 + -0.16668057) * fVar21 + 0.20000714)
              * fVar21 + -0.24999994) * fVar21 + 0.3333333) * fVar21 + -0.5)) * -2.0;
      auVar26._4_4_ =
           (auVar48._4_4_ * 0.6931472 + fVar39 +
           fVar39 * fVar39 *
           (((((((((fVar39 * 0.070376836 + -0.1151461) * fVar39 + 0.116769984) * fVar39 +
                 -0.12420141) * fVar39 + 0.14249323) * fVar39 + -0.16668057) * fVar39 + 0.20000714)
              * fVar39 + -0.24999994) * fVar39 + 0.3333333) * fVar39 + -0.5)) * -2.0;
      auVar26._8_4_ =
           (auVar48._8_4_ * 0.6931472 + fVar40 +
           fVar40 * fVar40 *
           (((((((((fVar40 * 0.070376836 + -0.1151461) * fVar40 + 0.116769984) * fVar40 +
                 -0.12420141) * fVar40 + 0.14249323) * fVar40 + -0.16668057) * fVar40 + 0.20000714)
              * fVar40 + -0.24999994) * fVar40 + 0.3333333) * fVar40 + -0.5)) * -2.0;
      auVar26._12_4_ =
           (auVar48._12_4_ * 0.6931472 + fVar41 +
           fVar41 * fVar41 *
           (((((((((fVar41 * 0.070376836 + -0.1151461) * fVar41 + 0.116769984) * fVar41 +
                 -0.12420141) * fVar41 + 0.14249323) * fVar41 + -0.16668057) * fVar41 + 0.20000714)
              * fVar41 + -0.24999994) * fVar41 + 0.3333333) * fVar41 + -0.5)) * -2.0;
      auVar49._8_4_ = 0x7fffffff;
      auVar49._0_8_ = 0x7fffffff7fffffff;
      auVar49._12_4_ = 0x7fffffff;
      auVar45 = vblendvps_avx(auVar26,auVar49,auVar45);
      auVar27._8_4_ = 0x42b0c0a5;
      auVar27._0_8_ = 0x42b0c0a542b0c0a5;
      auVar27._12_4_ = 0x42b0c0a5;
      auVar45 = vminps_avx(auVar45,auVar27);
      auVar28._8_4_ = 0xc2b0c0a5;
      auVar28._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar28._12_4_ = 0xc2b0c0a5;
      auVar58 = vmaxps_avx(auVar45,auVar28);
      auVar29._0_4_ = auVar58._0_4_ * 1.442695 + 0.5;
      auVar29._4_4_ = auVar58._4_4_ * 1.442695 + 0.5;
      auVar29._8_4_ = auVar58._8_4_ * 1.442695 + 0.5;
      auVar29._12_4_ = auVar58._12_4_ * 1.442695 + 0.5;
      auVar50._0_4_ = (int)auVar29._0_4_;
      auVar50._4_4_ = (int)auVar29._4_4_;
      auVar50._8_4_ = (int)auVar29._8_4_;
      auVar50._12_4_ = (int)auVar29._12_4_;
      auVar48 = vcvtdq2ps_avx(auVar50);
      auVar45 = vcmpps_avx(auVar29,auVar48,1);
      auVar45 = vandps_avx(auVar45,auVar59);
      auVar45 = vsubps_avx(auVar48,auVar45);
      auVar51._0_4_ = auVar45._0_4_ * 0.6931472;
      auVar51._4_4_ = auVar45._4_4_ * 0.6931472;
      auVar51._8_4_ = auVar45._8_4_ * 0.6931472;
      auVar51._12_4_ = auVar45._12_4_ * 0.6931472;
      auVar48 = vsubps_avx(auVar58,auVar51);
      fVar21 = auVar48._0_4_;
      fVar39 = auVar48._4_4_;
      fVar40 = auVar48._8_4_;
      fVar41 = auVar48._12_4_;
      auVar30._0_4_ = (int)auVar45._0_4_;
      auVar30._4_4_ = (int)auVar45._4_4_;
      auVar30._8_4_ = (int)auVar45._8_4_;
      auVar30._12_4_ = (int)auVar45._12_4_;
      auVar45 = vpslld_avx(auVar30,0x17);
      auVar45 = vpaddd_avx(auVar45,auVar59);
      auVar18._0_4_ =
           (fVar21 + 1.0 +
           fVar21 * fVar21 *
           (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
             0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5)) * auVar45._0_4_ + 1.0;
      auVar18._4_4_ =
           (fVar39 + 1.0 +
           fVar39 * fVar39 *
           (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
             0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar45._4_4_ + 1.0;
      auVar18._8_4_ =
           (fVar40 + 1.0 +
           fVar40 * fVar40 *
           (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
             0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar45._8_4_ + 1.0;
      auVar18._12_4_ =
           (fVar41 + 1.0 +
           fVar41 * fVar41 *
           (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
             0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar45._12_4_ + 1.0;
      auVar31._8_4_ = 0x40000000;
      auVar31._0_8_ = 0x4000000040000000;
      auVar31._12_4_ = 0x40000000;
      in_ZMM2 = ZEXT1664(auVar31);
      auVar45 = vdivps_avx(auVar31,auVar18);
      auVar15._0_4_ = (auVar45._0_4_ + -1.0) * auVar22._0_4_;
      auVar15._4_4_ = (auVar45._4_4_ + -1.0) * auVar22._4_4_;
      auVar15._8_4_ = (auVar45._8_4_ + -1.0) * auVar22._8_4_;
      auVar15._12_4_ = (auVar45._12_4_ + -1.0) * auVar22._12_4_;
      *(undefined1 (*) [16])*pauVar9 = auVar15;
      pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
      lVar12 = lVar12 + 4;
    }
    lVar8 = sVar4 * sVar3 * uVar14;
    for (; (int)lVar12 < iVar10; lVar12 = lVar12 + 1) {
      fVar21 = *(float *)((long)pvVar2 + lVar12 * 4 + lVar8);
      in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
      fVar39 = expf(fVar21);
      fVar39 = logf(fVar39 + 1.0);
      fVar39 = tanhf(fVar39);
      *(float *)((long)pvVar2 + lVar12 * 4 + lVar8) = fVar39 * fVar21;
    }
  }
  return 0;
}

Assistant:

int Mish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = mish_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanhf(logf(expf(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}